

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void sha1_update(sha1_ctx *ctx,uint8_t *input,uint32_t input_len)

{
  uint uVar1;
  uint uVar2;
  uint local_24;
  uint local_20;
  uint32_t j;
  uint32_t i;
  uint32_t input_len_local;
  uint8_t *input_local;
  sha1_ctx *ctx_local;
  
  uVar1 = ctx->count[0];
  uVar2 = input_len * 8 + ctx->count[0];
  ctx->count[0] = uVar2;
  if (uVar2 < uVar1) {
    ctx->count[1] = ctx->count[1] + 1;
  }
  ctx->count[1] = (input_len >> 0x1d) + ctx->count[1];
  local_24 = uVar1 >> 3 & 0x3f;
  if (local_24 + input_len < 0x40) {
    local_20 = 0;
  }
  else {
    local_20 = 0x40 - local_24;
    memcpy(ctx->buf + local_24,input,(ulong)local_20);
    sha1_transform(ctx->state,ctx->buf);
    for (; local_20 + 0x3f < input_len; local_20 = local_20 + 0x40) {
      sha1_transform(ctx->state,input + local_20);
    }
    local_24 = 0;
  }
  memcpy(ctx->buf + local_24,input + local_20,(ulong)(input_len - local_20));
  return;
}

Assistant:

void sha1_update(struct sha1_ctx *ctx, const uint8_t *input,
                 uint32_t input_len) {
  uint32_t i;
  uint32_t j;

  j = ctx->count[0];
  if ((ctx->count[0] += input_len << 3) < j)
    ctx->count[1]++;
  ctx->count[1] += (input_len >> 29);
  j = (j >> 3) & 63;
  if ((j + input_len) > 63) {
    memcpy(&ctx->buf[j], input, (i = 64 - j));
    sha1_transform(ctx->state, ctx->buf);
    for (; i + 63 < input_len; i += 64) {
      sha1_transform(ctx->state, &input[i]);
    }
    j = 0;
  } else {
    i = 0;
  }

  memcpy(&ctx->buf[j], &input[i], input_len - i);
}